

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O1

Nonnull<const_char_*>
absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char_const*,unsigned_char_const*>
          (uchar *v1,uchar *v2,Nonnull<const_char_*> exprtext)

{
  size_t sVar1;
  Nonnull<const_char_*> pcVar2;
  CheckOpMessageBuilder comb;
  undefined1 local_190 [376];
  
  CheckOpMessageBuilder::CheckOpMessageBuilder((CheckOpMessageBuilder *)local_190,exprtext);
  if (v1 == (uchar *)0x0) {
    v1 = (uchar *)"(null)";
  }
  sVar1 = strlen((char *)v1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)v1,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," vs. ",5);
  if (v2 == (uchar *)0x0) {
    v2 = (uchar *)"(null)";
  }
  sVar1 = strlen((char *)v2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)v2,sVar1);
  pcVar2 = CheckOpMessageBuilder::NewString((CheckOpMessageBuilder *)local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return pcVar2;
}

Assistant:

absl::Nonnull<const char*> MakeCheckOpString(
    T1 v1, T2 v2, absl::Nonnull<const char*> exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}